

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

void __thiscall HPresolve::getDualsSingletonRow(HPresolve *this,int row,int col)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  vector<int,_std::allocator<int>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  vector<double,_std::allocator<double>_> *this_02;
  vector<int,_std::allocator<int>_> *this_03;
  vector<int,_std::allocator<int>_> *this_04;
  vector<double,_std::allocator<double>_> *this_05;
  double value;
  double dVar2;
  double dVar3;
  double dVar4;
  reference pvVar5;
  _Elt_pointer pdVar6;
  reference pvVar7;
  ostream *poVar8;
  vector<double,_std::allocator<double>_> *this_06;
  _Elt_pointer ppVar9;
  size_type __n;
  size_type sVar10;
  size_type __n_00;
  undefined4 uVar11;
  undefined4 uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double local_100;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_b8;
  pair<int,_std::vector<double,_std::allocator<double>_>_> bnd;
  
  ppVar9 = (this->super_HPreData).oldBounds.c.
           super__Deque_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVar9 == *(_Elt_pointer *)
                 ((long)&(this->super_HPreData).oldBounds.c.
                         super__Deque_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish + 8)) {
    ppVar9 = (*(_Map_pointer *)
               ((long)&(this->super_HPreData).oldBounds.c.
                       super__Deque_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish + 0x18))[-1] + 0x10;
  }
  std::pair<int,_std::vector<double,_std::allocator<double>_>_>::pair(&bnd,ppVar9 + -1);
  std::
  deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::pop_back(&(this->super_HPreData).oldBounds.c);
  this_01 = &(this->super_HPreData).valueRowDual;
  __n = (size_type)row;
  pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_01,__n);
  *pvVar5 = 0.0;
  pdVar6 = (this->super_HPreData).postValue.c.super__Deque_base<double,_std::allocator<double>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pdVar6 == *(_Elt_pointer *)
                 ((long)&(this->super_HPreData).postValue.c.
                         super__Deque_base<double,_std::allocator<double>_>._M_impl.
                         super__Deque_impl_data._M_finish + 8)) {
    pdVar6 = (*(_Map_pointer *)
               ((long)&(this->super_HPreData).postValue.c.
                       super__Deque_base<double,_std::allocator<double>_>._M_impl.
                       super__Deque_impl_data._M_finish + 0x18))[-1] + 0x40;
  }
  value = pdVar6[-1];
  std::deque<double,_std::allocator<double>_>::pop_back(&(this->super_HPreData).postValue.c);
  dVar4 = HPreData::getaij(&this->super_HPreData,row,col);
  dVar15 = *bnd.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  dVar2 = bnd.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[1];
  dVar14 = bnd.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[2];
  dVar3 = bnd.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[3];
  this_02 = &(this->super_HPreData).valuePrimal;
  __n_00 = (size_type)col;
  pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_02,__n_00);
  dVar13 = *pvVar5 * dVar4 - dVar14;
  if ((dVar13 < this->tol || dVar13 == this->tol) ||
     (pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_02,__n_00),
     dVar13 = dVar3 - *pvVar5 * dVar4, dVar13 < this->tol || dVar13 == this->tol)) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_02,__n_00);
    if ((*pvVar5 <= dVar15) ||
       ((pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_02,__n_00),
        dVar2 < *pvVar5 || dVar2 == *pvVar5 ||
        (pvVar5 = std::vector<double,_std::allocator<double>_>::at
                            (&(this->super_HPreData).valueColDual,__n_00),
        ABS(*pvVar5) < this->tol || ABS(*pvVar5) == this->tol)))) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_02,__n_00);
      if ((*pvVar5 == dVar15) &&
         (((!NAN(*pvVar5) && !NAN(dVar15) &&
           (pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_02,__n_00),
           *pvVar5 <= dVar2 && dVar2 != *pvVar5)) &&
          (pvVar5 = std::vector<double,_std::allocator<double>_>::at
                              (&(this->super_HPreData).valueColDual,__n_00),
          *pvVar5 <= -this->tol && -this->tol != *pvVar5)))) goto LAB_001472d8;
      pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_02,__n_00);
      if (((*pvVar5 == dVar2) && (!NAN(*pvVar5) && !NAN(dVar2))) &&
         ((pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_02,__n_00),
          dVar15 < *pvVar5 &&
          (pvVar5 = std::vector<double,_std::allocator<double>_>::at
                              (&(this->super_HPreData).valueColDual,__n_00),
          this->tol <= *pvVar5 && *pvVar5 != this->tol)))) goto LAB_001472d8;
    }
    else {
LAB_001472d8:
      pvVar5 = std::vector<double,_std::allocator<double>_>::at
                         (&(this->super_HPreData).valueColDual,__n_00);
      *pvVar5 = 0.0;
    }
    pvVar1 = &(this->super_HPreData).Astart;
    pvVar7 = std::vector<int,_std::allocator<int>_>::at(pvVar1,__n_00);
    this_03 = &(this->super_HPreData).Aend;
    this_00 = &(this->super_HPreData).Aindex;
    this_04 = &(this->super_HPreData).flagRow;
    this_06 = &(this->super_HPreData).Avalue;
    local_100 = 0.0;
    for (sVar10 = (size_type)*pvVar7;
        pvVar7 = std::vector<int,_std::allocator<int>_>::at(this_03,__n_00),
        (long)sVar10 < (long)*pvVar7; sVar10 = sVar10 + 1) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::at(this_00,sVar10);
      pvVar7 = std::vector<int,_std::allocator<int>_>::at(this_04,(long)*pvVar7);
      if (*pvVar7 != 0) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::at(this_00,sVar10);
        pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_01,(long)*pvVar7);
        dVar13 = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_06,sVar10);
        local_100 = local_100 + dVar13 * *pvVar5;
      }
    }
    pvVar7 = std::vector<int,_std::allocator<int>_>::at(this_04,__n);
    *pvVar7 = 1;
    this_05 = &(this->super_HPreData).valueColDual;
    pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_05,__n_00);
    dVar13 = ((*pvVar5 - value) - local_100) / dVar4;
    if ((dVar13 != 0.0) || (NAN(dVar13))) {
      if (this->iKKTcheck == 1) {
        KktChStep::addCost(&(this->super_HPreData).chk,col,value);
      }
      if ((dVar3 != dVar14) || (NAN(dVar3) || NAN(dVar14))) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_02,__n_00);
        if ((*pvVar5 * dVar4 != dVar14) ||
           ((NAN(*pvVar5 * dVar4) || NAN(dVar14) || (dVar14 = this->tol, dVar13 <= dVar14)))) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_02,__n_00);
          if ((*pvVar5 * dVar4 != dVar3) ||
             ((NAN(*pvVar5 * dVar4) || NAN(dVar3) || (dVar14 = this->tol, -dVar14 <= dVar13))))
          goto LAB_0014758a;
        }
        local_d0 = 0.0;
        if (dVar13 <= dVar14) {
          local_d0 = 1e+200;
        }
        pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_02,__n_00);
        local_e0 = 1e+200;
        if ((*pvVar5 != dVar15) || (local_d8 = 0.0, dVar2 <= dVar15)) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_02,__n_00);
          local_d8 = -1e+200;
          if ((*pvVar5 != dVar2) || (dVar2 <= dVar15)) {
            if ((dVar15 != dVar2) || (NAN(dVar15) || NAN(dVar2))) goto LAB_001476a3;
            local_d8 = 0.0;
          }
          local_e0 = 0.0;
        }
LAB_001476a3:
        local_b8 = (double)(-(ulong)(dVar14 < dVar13) & 0xe974e718d7d7625a);
        if (dVar4 <= 0.0) {
          if (dVar4 < 0.0) {
            if ((-1e+200 < local_b8) &&
               (dVar15 = dVar4 * local_b8 + value + local_100, dVar15 < local_e0)) {
              local_e0 = dVar15;
            }
            if ((dVar14 < dVar13) && (dVar15 = dVar4 * 0.0 + value + local_100, local_d8 < dVar15))
            {
              local_d8 = dVar15;
            }
            if ((-1e+200 < local_d8) &&
               (dVar15 = ((local_d8 - local_100) - value) / dVar4, dVar15 < local_d0)) {
              local_d0 = dVar15;
            }
            if ((local_e0 < 1e+200) &&
               (dVar15 = ((local_d8 - local_100) - value) / dVar4, local_b8 < dVar15)) {
              local_b8 = dVar15;
            }
          }
LAB_001478b1:
          uVar11 = SUB84(local_d0,0);
          uVar12 = (undefined4)((ulong)local_d0 >> 0x20);
LAB_001478b7:
          local_100 = (double)CONCAT44(uVar12,uVar11);
        }
        else {
          if ((-1e+200 < local_b8) &&
             (dVar15 = dVar4 * local_b8 + value + local_100, local_d8 < dVar15)) {
            local_d8 = dVar15;
          }
          if ((dVar14 < dVar13) && (dVar15 = dVar4 * 0.0 + value + local_100, dVar15 < local_e0)) {
            local_e0 = dVar15;
          }
          if ((-1e+200 < local_d8) &&
             (dVar15 = ((local_d8 - local_100) - value) / dVar4, local_b8 < dVar15)) {
            local_b8 = dVar15;
          }
          if (1e+200 <= local_e0) goto LAB_001478b1;
          local_100 = ((local_e0 - local_100) - value) / dVar4;
          uVar11 = SUB84(local_d0,0);
          uVar12 = (undefined4)((ulong)local_d0 >> 0x20);
          if (local_d0 <= local_100) goto LAB_001478b7;
        }
        std::operator<<((ostream *)&std::cout,"loY= ");
        poVar8 = std::ostream::_M_insert<double>(local_b8);
        std::operator<<(poVar8," upY= ");
        poVar8 = std::ostream::_M_insert<double>(local_100);
        std::operator<<(poVar8,"loZ= ");
        poVar8 = std::ostream::_M_insert<double>(local_d8);
        std::operator<<(poVar8," upZ= ");
        poVar8 = std::ostream::_M_insert<double>(local_e0);
        std::endl<char,std::char_traits<char>>(poVar8);
        pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_01,__n);
        *pvVar5 = 0.0;
        pvVar7 = std::vector<int,_std::allocator<int>_>::at(pvVar1,__n_00);
        local_100 = 0.0;
        for (sVar10 = (size_type)*pvVar7;
            pvVar7 = std::vector<int,_std::allocator<int>_>::at(this_03,__n_00),
            (long)sVar10 < (long)*pvVar7; sVar10 = sVar10 + 1) {
          pvVar7 = std::vector<int,_std::allocator<int>_>::at(this_00,sVar10);
          pvVar7 = std::vector<int,_std::allocator<int>_>::at(this_04,(long)*pvVar7);
          if (*pvVar7 != 0) {
            pvVar7 = std::vector<int,_std::allocator<int>_>::at(this_00,sVar10);
            pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_01,(long)*pvVar7);
            dVar15 = *pvVar5;
            pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_06,sVar10);
            local_100 = local_100 + dVar15 * *pvVar5;
          }
        }
        pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_05,__n_00);
        dVar15 = value + local_100;
        if (((0.0 < *pvVar5) && (dVar15 < 0.0)) ||
           ((pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_05,__n_00),
            *pvVar5 <= 0.0 && *pvVar5 != 0.0 && (0.0 < dVar15)))) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_01,__n);
          *pvVar5 = (-value - local_100) / dVar4;
          pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_05,__n_00);
          *pvVar5 = 0.0;
          if (this->iKKTcheck == 1) {
            pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_02,__n_00);
            dVar15 = *pvVar5;
            pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_05,__n_00);
            KktChStep::addChange(&(this->super_HPreData).chk,2,0,col,dVar15,*pvVar5,value);
          }
        }
        else {
          pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_05,__n_00);
          *pvVar5 = dVar15;
        }
        goto LAB_00147666;
      }
LAB_0014758a:
      pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_01,__n);
      *pvVar5 = dVar13;
    }
  }
  else {
    pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_01,__n);
    *pvVar5 = 0.0;
  }
  pvVar7 = std::vector<int,_std::allocator<int>_>::at(&(this->super_HPreData).flagRow,__n);
  *pvVar7 = 1;
  pvVar1 = &(this->super_HPreData).nonbasicFlag;
  pvVar7 = std::vector<int,_std::allocator<int>_>::at(pvVar1,__n_00);
  if (*pvVar7 == 1) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_02,__n_00);
    if ((*pvVar5 != dVar15) || (NAN(*pvVar5) || NAN(dVar15))) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_02,__n_00);
      if ((*pvVar5 != dVar2) || (NAN(*pvVar5) || NAN(dVar2))) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::at(pvVar1,__n_00);
        *pvVar7 = 0;
        (this->super_HPreData).nonbasicFlag.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[(long)(this->super_HPreData).numColOriginal + __n] = 1;
        goto LAB_00147666;
      }
    }
  }
  else {
    pvVar7 = std::vector<int,_std::allocator<int>_>::at(pvVar1,__n_00);
    if (*pvVar7 != 0) goto LAB_00147666;
  }
  (this->super_HPreData).nonbasicFlag.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[(long)(this->super_HPreData).numColOriginal + __n] = 0;
LAB_00147666:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&bnd.second.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void HPresolve::getDualsSingletonRow( int row, int col ) {

	pair< int ,vector<double> > bnd = oldBounds.top(); oldBounds.pop();

	valueRowDual.at(row) = 0;
	double cost = postValue.top(); postValue.pop();
	double aij = getaij(row, col);
	double l = (get<1>(bnd))[0];
	double u = (get<1>(bnd))[1];
	double lrow = (get<1>(bnd))[2];
	double urow = (get<1>(bnd))[3];
	if ((aij*valuePrimal.at(col) - lrow) > tol && ( -aij*valuePrimal.at(col) + urow) > tol) {
		valueRowDual.at(row) = 0;
		//row is nonbasic

	}
	else {
		if  ((valuePrimal.at(col) > l && valuePrimal.at(col) < u && abs(valueColDual.at(col)) > tol ) ||
				(valuePrimal.at(col) == l && valuePrimal.at(col) < u && valueColDual.at(col) < -tol ) ||
				(valuePrimal.at(col) == u && valuePrimal.at(col) > l && valueColDual.at(col) > tol )) {

			valueColDual.at(col) = 0;
		}

		double sum = 0;
		for (int k=Astart.at(col); k<Aend.at(col);++k )
			if (flagRow.at(Aindex.at(k)))
				sum = sum + valueRowDual.at(Aindex.at(k))*Avalue.at(k);

		flagRow.at(row) = 1;


		double y = (valueColDual.at(col) - cost - sum)/aij;
		if (y != 0) {
			if (iKKTcheck == 1)
				chk.addCost(col, cost);

			//aij * yi + sum + ci = zi
			if (urow != lrow)
				if  ((aij*valuePrimal.at(col) == lrow && y >  tol) ||
					(aij*valuePrimal.at(col) == urow && y < -tol)) {


					//bounds on y_row
					double loY = -HSOL_CONST_INF;
					double upY = HSOL_CONST_INF;

					if (y>tol)
						upY = 0;
					else //y < -tol
						loY = 0;

					//bounds on z_col
					double loZ = -HSOL_CONST_INF;
					double upZ = HSOL_CONST_INF;
					if  (valuePrimal.at(col) == l && l < u ) {
						loZ = 0;
					}
					else if (valuePrimal.at(col) == u && l < u) {
						upZ = 0;
					}
					else if (l==u) {
						loZ = 0;
						upZ = 0;
					}
					//aij * yi + sum + ci = zi

					double lo = -HSOL_CONST_INF;
					double up = HSOL_CONST_INF;
					//bounds on z by y
					if (aij > 0) {
						if (loY >  -HSOL_CONST_INF) {
							lo = sum + cost + aij * loY;
							if (lo>loZ)
								loZ = lo;
						}
						if (upY < HSOL_CONST_INF) {
							up = sum + cost + aij * upY;
							if (up<upZ)
								upZ = up;
						}
					}
					else if (aij < 0) {
						if (loY >  -HSOL_CONST_INF) {
							up = sum + cost + aij * loY;
							if (up<upZ)
								upZ = up;
						}
						if (upY < HSOL_CONST_INF) {
							lo = sum + cost + aij * upY;
							if (lo>loZ)
								loZ = lo;
						}
					}
					//bounds on y by z
					//aij * yi  = zi - sum - ci
					if (aij > 0) {
						if (loZ >  -HSOL_CONST_INF) {
							lo = (loZ - sum - cost )/aij;
							if (lo>loY)
								loY = lo;
						}
						if (upZ < HSOL_CONST_INF) {
							up = (upZ - sum - cost )/aij;
							if (up<upY)
								upY = up;
						}
					}
					else if (aij < 0) {
						if (loZ >  -HSOL_CONST_INF) {
							up = (loZ - sum - cost )/aij;
							if (up<upY)
								upY = up;
						}
						if (upZ < HSOL_CONST_INF) {
							lo = (loZ - sum - cost )/aij;
							if (lo>loY)
								loY = lo;
						}
					}

					cout<< "loY= "<< loY <<" upY= "<<upY<<"loZ= "<< loZ <<" upZ= "<<upZ<<endl;

					valueRowDual.at(row) = 0;

					sum = 0;
					for (int k=Astart.at(col); k<Aend.at(col);++k )
						if (flagRow.at(Aindex.at(k))) {
							sum = sum + valueRowDual.at(Aindex.at(k))*Avalue.at(k);
							//cout<<" row "<<Aindex.at(k)<<" dual "<<valueRowDual.at(Aindex.at(k))<<" a_"<<Aindex.at(k)<<"_"<<j<<"\n";
						}
					double newz = cost + sum;
					if ((valueColDual.at(col) > 0 && newz < 0) ||
						(valueColDual.at(col) < 0 && newz > 0)) {
						//valueColDual.at(col) = 0;
						//update valueRowDual.at(row)
						//newz = 0 if cost + sum + aijyi = 0 so aijyi = - cost - sum

						valueRowDual.at(row) = (-cost - sum)/aij;
						valueColDual.at(col) = 0;
						if (iKKTcheck == 1) {
							chk.addChange(2, 0, col, valuePrimal.at(col), valueColDual.at(col), cost);
						}
						return;

					}

					valueColDual.at(col) = newz;
					return;
				}
		valueRowDual.at(row) = y;
		}
	}

	flagRow.at(row) = 1;
	//row is introduced so something needs to become basic :



	//check if x is at a bound forced by the singleton row: then x becomes basic and row nonbasic
	if (nonbasicFlag.at(col) == 1) {
		// x was not basic but is now
		if (valuePrimal.at(col)  != l && valuePrimal.at(col) != u ) {
			nonbasicFlag.at(col) = 0;
			nonbasicFlag[numColOriginal + row] = 1;
		}
		// x was not basic and is not now either, row is basic
		else
			nonbasicFlag[numColOriginal + row] = 0;
	}
	else if (nonbasicFlag.at(col) == 0)  // x is basic
		nonbasicFlag[numColOriginal + row] = 0; //row becomes basic too

}